

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
proposeMove(GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *this,
           size_t v0,size_t v1)

{
  value_type *__x;
  size_t in_RDI;
  EdgeOperation move;
  size_t in_stack_00000140;
  size_t in_stack_00000148;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_stack_00000150;
  size_t in_stack_ffffffffffffffb8;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffe0;
  
  increaseEdition(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
            (in_stack_00000150,in_stack_00000148,in_stack_00000140);
  if ((double)in_stack_ffffffffffffffe0 <= 0.0) {
    __x = (value_type *)getEdition(in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffb8);
    std::
    priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
    ::push((priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
            *)in_stack_ffffffffffffffe0,__x);
  }
  return;
}

Assistant:

inline void proposeMove(const size_t v0, const size_t v1)
    {
        increaseEdition(v0, v1); // invalidate old moves along (v0, v1)
        auto move = DynamicLineage<EVA>::proposeMove(v0, v1);
        if (move.delta <= .0) {
            move.edition = getEdition(move.v0, move.v1);
            queue_.push(move);
        }
    }